

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O1

int __thiscall
ncnn::GridSample::forward
          (GridSample *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *pMVar2;
  int *piVar3;
  undefined4 uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  float *pfVar9;
  ulong uVar10;
  void *pvVar11;
  uint uVar12;
  long lVar13;
  float *pfVar14;
  int iVar15;
  int iVar16;
  int y;
  int iVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  float fVar21;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  Mat m;
  Mat local_298;
  int local_244;
  ulong local_240;
  undefined8 local_238;
  undefined1 local_228 [8];
  undefined4 uStack_220;
  undefined4 uStack_21c;
  Mat *local_218;
  GridSample *local_210;
  float local_204;
  float local_200;
  float local_1fc;
  undefined8 local_1f8;
  void *local_1e0;
  undefined1 local_1d8 [16];
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  float local_128;
  void *local_118;
  void *local_110;
  void *local_108;
  int local_fc;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  float local_c8;
  float local_b8;
  float local_a8;
  ulong local_98;
  size_t local_90;
  Option *local_88;
  ulong local_80;
  float local_78;
  undefined4 uStack_74;
  float local_68;
  float local_58;
  undefined1 local_48 [16];
  long local_38;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1c0 = (ulong)(uint)pMVar1->w;
  local_1b8 = (ulong)(uint)pMVar1->h;
  local_98 = (ulong)(uint)pMVar1->d;
  uVar12 = pMVar1->c;
  uVar7 = (ulong)uVar12;
  iVar6 = pMVar1->dims;
  local_90 = pMVar1->elemsize;
  local_218 = pMVar2;
  local_210 = this;
  local_88 = opt;
  if (iVar6 != 4) {
    if (iVar6 != 3) {
      return 0;
    }
    local_1f8 = (ulong)(uint)pMVar1[1].h;
    local_240 = (ulong)(uint)pMVar1[1].c;
    local_fc = iVar6;
    Mat::create(pMVar2,pMVar1[1].h,pMVar1[1].c,uVar12,local_90,opt->blob_allocator);
    if (pMVar2->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar2->c * pMVar2->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    iVar6 = local_210->sample_type;
    iVar19 = (int)local_1c0;
    iVar16 = (int)local_1b8;
    if (iVar6 == 1) {
      if (0 < (int)uVar12) {
        local_1a8 = CONCAT44(local_1a8._4_4_,(float)(iVar19 + -1));
        local_a8 = (float)(iVar16 + -1);
        local_b8 = (float)iVar19 * 0.5;
        local_c8 = (float)iVar16 * 0.5;
        uVar5 = 0;
        do {
          local_298.c = pMVar1->d;
          uVar10 = pMVar1->elemsize;
          local_298.data = (void *)(pMVar1->cstep * uVar5 * uVar10 + (long)pMVar1->data);
          local_298.elempack = pMVar1->elempack;
          local_298.allocator = pMVar1->allocator;
          local_298.refcount._0_4_ = 0;
          local_298.refcount._4_4_ = 0;
          local_298.elemsize._0_4_ = (undefined4)uVar10;
          local_298.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
          local_298.d = 1;
          local_298.h = pMVar1->h;
          uVar8 = (long)pMVar1->h * (long)pMVar1->w;
          local_298.w = pMVar1->w;
          local_298.dims = pMVar1->dims + -1;
          local_298.cstep = (uVar10 * uVar8 + 0xf & 0xfffffffffffffff0) / uVar10;
          if (pMVar1->dims == 4) {
            local_298.cstep = uVar8;
          }
          local_f8 = uVar5;
          if (0 < (int)local_240) {
            pfVar9 = (float *)(local_218->cstep * uVar5 * local_218->elemsize +
                              (long)local_218->data);
            local_d8 = pMVar1[1].cstep * pMVar1[1].elemsize;
            pvVar11 = pMVar1[1].data;
            local_148 = (void *)CONCAT44(local_148._4_4_,local_210->padding_mode);
            iVar6 = local_210->align_corner;
            local_e8 = 0;
            local_158 = CONCAT44(local_158._4_4_,iVar6);
            do {
              if (0 < (int)(float)local_1f8) {
                lVar13 = 0;
                local_138 = pvVar11;
                do {
                  fVar24 = *(float *)((long)local_138 + lVar13 * 8);
                  if (iVar6 == 0) {
                    fVar24 = (fVar24 + 1.0) * local_b8 + -0.5;
                  }
                  else {
                    fVar24 = (fVar24 * 0.5 + 0.5) * (float)local_1a8;
                  }
                  fVar22 = *(float *)((long)local_138 + lVar13 * 8 + 4);
                  local_1d8._0_8_ = lVar13;
                  if (iVar6 == 0) {
                    fVar22 = (fVar22 + 1.0) * local_c8 + -0.5;
                  }
                  else {
                    fVar22 = (fVar22 * 0.5 + 0.5) * local_a8;
                  }
                  local_228._0_4_ = fVar22;
                  local_238 = pfVar9;
                  fVar22 = floorf(fVar24);
                  local_178 = (float *)CONCAT44(extraout_XMM0_Db_09,fVar22);
                  iVar16 = (int)fVar22;
                  fVar22 = floorf((float)local_228._0_4_);
                  local_188 = CONCAT44(extraout_XMM0_Db_10,fVar22);
                  iVar18 = (int)fVar22;
                  iVar19 = (int)(float)local_148;
                  iVar6 = (int)(float)local_158;
                  fVar22 = get_value_bounded(&local_298,iVar16,iVar18,(int)(float)local_148,
                                             (int)(float)local_158);
                  local_168._0_4_ = fVar22;
                  fVar22 = get_value_bounded(&local_298,iVar16 + 1,iVar18,iVar19,iVar6);
                  local_198 = CONCAT44(local_198._4_4_,fVar22);
                  local_128 = get_value_bounded(&local_298,iVar16,iVar18 + 1,iVar19,iVar6);
                  fVar22 = get_value_bounded(&local_298,iVar16 + 1,iVar18 + 1,iVar19,iVar6);
                  fVar24 = fVar24 - (float)(int)(float)local_178;
                  fVar21 = (float)local_198 * fVar24 + (float)local_168._0_4_ * (1.0 - fVar24);
                  *local_238 = (((1.0 - fVar24) * local_128 - fVar21) + fVar24 * fVar22) *
                               ((float)local_228._0_4_ - (float)(int)(float)local_188) + fVar21;
                  pfVar9 = local_238 + 1;
                  lVar13 = local_1d8._0_8_ + 1;
                  pvVar11 = local_138;
                } while ((float)local_1f8 != (float)(int)lVar13);
              }
              local_e8 = local_e8 + 1;
              pvVar11 = (void *)((long)pvVar11 + local_d8);
            } while (local_e8 != local_240);
          }
          uVar5 = local_f8;
          piVar3 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_298.allocator == (Allocator *)0x0) {
                if (local_298.data != (void *)0x0) {
                  free(local_298.data);
                }
              }
              else {
                (*(local_298.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_298.cstep = 0;
          local_298.data = (void *)0x0;
          local_298.refcount._0_4_ = 0;
          local_298.refcount._4_4_ = 0;
          local_298.elemsize._0_4_ = 0;
          local_298.elemsize._4_4_ = 0;
          local_298.elempack = 0;
          local_298.dims = 0;
          local_298.w = 0;
          local_298.h = 0;
          local_298.d = 0;
          local_298.c = 0;
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar7);
      }
    }
    else if (iVar6 == 2) {
      if (0 < (int)uVar12) {
        local_238 = (float *)CONCAT44(local_238._4_4_,(float)(iVar19 + -1));
        local_1d8._0_4_ = (float)(iVar16 + -1);
        local_178 = (float *)CONCAT44(local_178._4_4_,(float)iVar16 * 0.5);
        uVar5 = 0;
        do {
          local_298.c = pMVar1->d;
          uVar10 = pMVar1->elemsize;
          local_298.data = (void *)(pMVar1->cstep * uVar5 * uVar10 + (long)pMVar1->data);
          local_298.elempack = pMVar1->elempack;
          local_298.allocator = pMVar1->allocator;
          local_298.refcount._0_4_ = 0;
          local_298.refcount._4_4_ = 0;
          local_298.elemsize._0_4_ = (undefined4)uVar10;
          local_298.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
          local_298.d = 1;
          local_298.h = pMVar1->h;
          uVar8 = (long)pMVar1->h * (long)pMVar1->w;
          local_298.w = pMVar1->w;
          local_298.dims = pMVar1->dims + -1;
          local_298.cstep = (uVar10 * uVar8 + 0xf & 0xfffffffffffffff0) / uVar10;
          if (pMVar1->dims == 4) {
            local_298.cstep = uVar8;
          }
          local_198 = uVar5;
          if (0 < (int)local_240) {
            pfVar9 = (float *)(local_218->cstep * uVar5 * local_218->elemsize +
                              (long)local_218->data);
            local_168._0_8_ = pMVar1[1].cstep * pMVar1[1].elemsize;
            pvVar11 = pMVar1[1].data;
            iVar6 = local_210->padding_mode;
            iVar16 = local_210->align_corner;
            uVar5 = 0;
            do {
              local_188 = uVar5;
              if (0 < (int)(float)local_1f8) {
                lVar13 = 0;
                do {
                  fVar24 = *(float *)((long)pvVar11 + lVar13 * 8);
                  if (iVar16 == 0) {
                    fVar24 = (fVar24 + 1.0) * (float)iVar19 * 0.5 + -0.5;
                  }
                  else {
                    fVar24 = (fVar24 * 0.5 + 0.5) * (float)local_238;
                  }
                  fVar22 = *(float *)((long)pvVar11 + lVar13 * 8 + 4);
                  if (iVar16 == 0) {
                    fVar22 = (fVar22 + 1.0) * (float)local_178 + -0.5;
                  }
                  else {
                    fVar22 = (fVar22 * 0.5 + 0.5) * (float)local_1d8._0_4_;
                  }
                  local_228._0_4_ = fVar22;
                  fVar24 = roundf(fVar24);
                  fVar22 = roundf((float)local_228._0_4_);
                  fVar24 = get_value_bounded(&local_298,(int)fVar24,(int)fVar22,iVar6,iVar16);
                  *pfVar9 = fVar24;
                  pfVar9 = pfVar9 + 1;
                  lVar13 = lVar13 + 1;
                } while ((float)local_1f8 != (float)(int)lVar13);
              }
              uVar5 = local_188 + 1;
              pvVar11 = (void *)((long)pvVar11 + local_168._0_8_);
            } while (uVar5 != local_240);
          }
          uVar5 = local_198;
          piVar3 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_298.allocator == (Allocator *)0x0) {
                if (local_298.data != (void *)0x0) {
                  free(local_298.data);
                }
              }
              else {
                (*(local_298.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_298.cstep = 0;
          local_298.data = (void *)0x0;
          local_298.refcount._0_4_ = 0;
          local_298.refcount._4_4_ = 0;
          local_298.elemsize._0_4_ = 0;
          local_298.elemsize._4_4_ = 0;
          local_298.elempack = 0;
          local_298.dims = 0;
          local_298.w = 0;
          local_298.h = 0;
          local_298.d = 0;
          local_298.c = 0;
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar7);
      }
    }
    else if ((iVar6 == 3) && (0 < (int)uVar12)) {
      local_204 = (float)(iVar19 + -1);
      local_1e0 = (void *)CONCAT44(local_1e0._4_4_,(float)(iVar16 + -1));
      local_110 = (void *)CONCAT44(local_110._4_4_,(float)iVar19 * 0.5);
      local_118 = (void *)CONCAT44(local_118._4_4_,(float)iVar16 * 0.5);
      uVar5 = 0;
      do {
        local_298.c = pMVar1->d;
        uVar10 = pMVar1->elemsize;
        local_298.data = (void *)(pMVar1->cstep * uVar5 * uVar10 + (long)pMVar1->data);
        local_298.elempack = pMVar1->elempack;
        local_298.allocator = pMVar1->allocator;
        local_298.refcount._0_4_ = 0;
        local_298.refcount._4_4_ = 0;
        local_298.elemsize._0_4_ = (undefined4)uVar10;
        local_298.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
        local_298.d = 1;
        local_298.h = pMVar1->h;
        uVar8 = (long)pMVar1->h * (long)pMVar1->w;
        local_298.w = pMVar1->w;
        local_298.dims = pMVar1->dims + -1;
        local_298.cstep = (uVar10 * uVar8 + 0xf & 0xfffffffffffffff0) / uVar10;
        if (pMVar1->dims == 4) {
          local_298.cstep = uVar8;
        }
        local_80 = uVar5;
        if (0 < (int)local_240) {
          pfVar9 = (float *)(local_218->cstep * uVar5 * local_218->elemsize + (long)local_218->data)
          ;
          local_38 = pMVar1[1].cstep * pMVar1[1].elemsize;
          pvVar11 = pMVar1[1].data;
          iVar6 = local_210->padding_mode;
          iVar19 = local_210->align_corner;
          local_1b0 = 0;
          local_244 = iVar19;
          do {
            if (0 < (int)(float)local_1f8) {
              uVar5 = 0;
              local_108 = pvVar11;
              do {
                fVar24 = *(float *)((long)local_108 + uVar5 * 8);
                if (iVar19 == 0) {
                  fVar24 = (fVar24 + 1.0) * local_110._0_4_ + -0.5;
                }
                else {
                  fVar24 = (fVar24 * 0.5 + 0.5) * local_204;
                }
                fVar22 = *(float *)((long)local_108 + uVar5 * 8 + 4);
                local_168._0_8_ = pfVar9;
                if (iVar19 == 0) {
                  fVar22 = (fVar22 + 1.0) * local_118._0_4_ + -0.5;
                }
                else {
                  fVar22 = (fVar22 * 0.5 + 0.5) * local_1e0._0_4_;
                }
                local_1d8 = ZEXT416((uint)fVar22);
                local_48 = ZEXT416((uint)fVar24);
                local_198 = uVar5;
                local_58 = floorf(fVar24);
                iVar15 = (int)local_58;
                fVar24 = floorf((float)local_1d8._0_4_);
                iVar19 = local_244;
                local_e8 = CONCAT44(extraout_XMM0_Db,fVar24);
                y = (int)fVar24;
                local_238 = (float *)CONCAT44(local_238._4_4_,iVar15 + -1);
                iVar16 = y + -1;
                local_188 = CONCAT44(local_188._4_4_,iVar15 + 1);
                local_1a8 = CONCAT44(local_1a8._4_4_,y + 1);
                local_178 = (float *)CONCAT44(local_178._4_4_,iVar15 + 2);
                local_200 = (float)(y + 2);
                fVar24 = get_value_bounded(&local_298,iVar15 + -1,iVar16,iVar6,local_244);
                local_148 = (void *)CONCAT44(extraout_XMM0_Db_00,fVar24);
                fVar24 = get_value_bounded(&local_298,iVar15,iVar16,iVar6,iVar19);
                local_158 = CONCAT44(extraout_XMM0_Db_01,fVar24);
                local_228._0_4_ =
                     get_value_bounded(&local_298,(int)(float)local_188,iVar16,iVar6,iVar19);
                local_228._4_4_ = extraout_XMM0_Db_02;
                uStack_220 = extraout_XMM0_Dc;
                uStack_21c = extraout_XMM0_Dd;
                local_128 = get_value_bounded(&local_298,(int)(float)local_178,iVar16,iVar6,iVar19);
                local_b8 = get_value_bounded(&local_298,(int)(float)local_238,y,iVar6,iVar19);
                local_a8 = get_value_bounded(&local_298,iVar15,y,iVar6,iVar19);
                iVar18 = (int)(float)local_188;
                local_c8 = get_value_bounded(&local_298,(int)(float)local_188,y,iVar6,iVar19);
                iVar17 = (int)(float)local_178;
                fVar24 = get_value_bounded(&local_298,(int)(float)local_178,y,iVar6,iVar19);
                local_138 = (void *)CONCAT44(extraout_XMM0_Db_03,fVar24);
                iVar16 = (int)(float)local_1a8;
                fVar24 = get_value_bounded(&local_298,(int)(float)local_238,(int)(float)local_1a8,
                                           iVar6,iVar19);
                local_d8 = CONCAT44(extraout_XMM0_Db_04,fVar24);
                fVar24 = get_value_bounded(&local_298,iVar15,iVar16,iVar6,iVar19);
                local_f8 = CONCAT44(extraout_XMM0_Db_05,fVar24);
                local_78 = get_value_bounded(&local_298,iVar18,iVar16,iVar6,iVar19);
                uStack_74 = extraout_XMM0_Db_06;
                fVar22 = get_value_bounded(&local_298,iVar17,iVar16,iVar6,iVar19);
                fVar24 = local_200;
                local_1a8 = CONCAT44(extraout_XMM0_Db_07,fVar22);
                local_1fc = get_value_bounded(&local_298,(int)(float)local_238,(int)local_200,iVar6,
                                              iVar19);
                local_68 = get_value_bounded(&local_298,iVar15,(int)fVar24,iVar6,iVar19);
                fVar22 = get_value_bounded(&local_298,iVar18,(int)fVar24,iVar6,iVar19);
                fVar24 = get_value_bounded(&local_298,iVar17,(int)fVar24,iVar6,iVar19);
                local_238 = (float *)CONCAT44(extraout_XMM0_Db_08,fVar24);
                fVar21 = (float)local_48._0_4_ - (float)(int)local_58;
                fVar23 = fVar21 + 1.0;
                fVar26 = 1.0 - fVar21;
                uStack_220 = local_228._4_4_;
                local_228._4_4_ = local_78;
                uStack_21c = uStack_74;
                fVar29 = (float)local_1d8._0_4_ - (float)(int)(float)local_e8;
                fVar25 = 1.0 - fVar29;
                fVar27 = fVar29 + 1.0;
                fVar28 = (3.75 - fVar23 * 0.75) * fVar23 * fVar23 + (3.0 - fVar23 * 6.0);
                fVar21 = fVar21 * fVar21 * (fVar21 * 1.25 + -2.25) + 1.0;
                fVar23 = fVar26 * fVar26 * (fVar26 * 1.25 + -2.25);
                fVar30 = fVar23 + 1.0;
                fVar31 = fVar23 + fVar21 + fVar28;
                fVar26 = fVar25 * fVar25 * (fVar25 * 1.25 + -2.25);
                fVar23 = fVar29 * fVar29 * (fVar29 * 1.25 + -2.25) + 1.0;
                fVar25 = (3.0 - fVar27 * 6.0) + fVar27 * fVar27 * (3.75 - fVar27 * 0.75);
                *(float *)local_168._0_8_ =
                     (fVar23 + fVar26 + fVar25) *
                     (fVar24 * fVar31 - (fVar30 * fVar22 + local_68 * fVar21 + fVar28 * local_1fc))
                     + (((float)local_228._0_4_ * fVar30 +
                        fVar21 * (float)local_158 + (float)local_148 * fVar28) - local_128 * fVar31)
                       * fVar25 +
                     ((local_78 * fVar30 + fVar21 * (float)local_f8 + (float)local_d8 * fVar28) -
                     (float)local_1a8 * fVar31) * (fVar26 + 1.0) +
                     ((local_c8 * fVar30 + local_a8 * fVar21 + local_b8 * fVar28) -
                     (float)local_138 * fVar31) * fVar23;
                pfVar9 = (float *)(local_168._0_8_ + 4);
                uVar5 = local_198 + 1;
                pvVar11 = local_108;
              } while ((float)local_1f8 != (float)(int)uVar5);
            }
            local_1b0 = local_1b0 + 1;
            pvVar11 = (void *)((long)pvVar11 + local_38);
          } while (local_1b0 != local_240);
        }
        uVar5 = local_80;
        piVar3 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_298.allocator == (Allocator *)0x0) {
              if (local_298.data != (void *)0x0) {
                free(local_298.data);
              }
            }
            else {
              (*(local_298.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_298.cstep = 0;
        local_298.data = (void *)0x0;
        local_298.refcount._0_4_ = 0;
        local_298.refcount._4_4_ = 0;
        local_298.elemsize._0_4_ = 0;
        local_298.elemsize._4_4_ = 0;
        local_298.elempack = 0;
        local_298.dims = 0;
        local_298.w = 0;
        local_298.h = 0;
        local_298.d = 0;
        local_298.c = 0;
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar7);
    }
    if (bVar20) {
      return -100;
    }
    if (local_fc != 4) {
      return 0;
    }
  }
  pMVar2 = local_218;
  local_244 = pMVar1[1].h;
  fVar24 = (float)pMVar1[1].d;
  local_1e0 = (void *)(ulong)(uint)pMVar1[1].c;
  Mat::create(local_218,local_244,(int)fVar24,pMVar1[1].c,uVar12,local_90,local_88->blob_allocator);
  iVar6 = -100;
  if ((pMVar2->data == (void *)0x0) || ((long)pMVar2->c * pMVar2->cstep == 0)) {
LAB_0058dc7f:
    bVar20 = false;
  }
  else {
    iVar19 = local_210->sample_type;
    bVar20 = true;
    iVar16 = (int)local_1c0;
    iVar18 = (int)local_1b8;
    iVar17 = (int)local_98;
    if (iVar19 == 1) {
      if ((int)uVar12 < 1) goto LAB_0058e687;
      local_58 = (float)(iVar16 + -1);
      local_1fc = (float)(iVar18 + -1);
      local_68 = (float)(iVar17 + -1);
      local_200 = (float)iVar16 * 0.5;
      local_78 = (float)iVar18 * 0.5;
      local_108 = (void *)CONCAT44(local_108._4_4_,(float)iVar17 * 0.5);
      local_1b0 = 0;
      do {
        local_298.c = pMVar1->d;
        uVar5 = pMVar1->elemsize;
        local_298.data = (void *)(pMVar1->cstep * local_1b0 * uVar5 + (long)pMVar1->data);
        local_298.elempack = pMVar1->elempack;
        local_298.allocator = pMVar1->allocator;
        local_298.refcount._0_4_ = 0;
        local_298.refcount._4_4_ = 0;
        local_298.elemsize._0_4_ = (undefined4)uVar5;
        local_298.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
        local_298.d = 1;
        local_298.h = pMVar1->h;
        uVar10 = (long)pMVar1->h * (long)pMVar1->w;
        local_298.w = pMVar1->w;
        local_298.dims = pMVar1->dims + -1;
        local_298.cstep = (uVar5 * uVar10 + 0xf & 0xfffffffffffffff0) / uVar5;
        if (pMVar1->dims == 4) {
          local_298.cstep = uVar10;
        }
        if (0 < (int)local_1e0._0_4_) {
          pfVar9 = (float *)(local_218->cstep * local_1b0 * local_218->elemsize +
                            (long)local_218->data);
          local_118 = pMVar1[1].data;
          local_240 = pMVar1[1].cstep * pMVar1[1].elemsize;
          pvVar11 = (void *)0x0;
          do {
            local_110 = pvVar11;
            if (0 < (int)fVar24) {
              pfVar14 = (float *)(local_240 * (long)pvVar11 + (long)local_118);
              local_f8 = CONCAT44(local_f8._4_4_,local_210->padding_mode);
              iVar6 = local_210->align_corner;
              fVar22 = 0.0;
              local_48._0_4_ = iVar6;
              do {
                iVar19 = local_244;
                local_204 = fVar22;
                if (0 < local_244) {
                  do {
                    if (iVar6 == 0) {
                      fVar22 = (*pfVar14 + 1.0) * local_200 + -0.5;
                    }
                    else {
                      fVar22 = (*pfVar14 * 0.5 + 0.5) * local_58;
                    }
                    if (iVar6 == 0) {
                      fVar21 = (pfVar14[1] + 1.0) * local_78 + -0.5;
                    }
                    else {
                      fVar21 = (pfVar14[1] * 0.5 + 0.5) * local_1fc;
                    }
                    _local_228 = ZEXT416((uint)fVar21);
                    local_188 = CONCAT44(local_188._4_4_,iVar19);
                    if (iVar6 == 0) {
                      fVar21 = (pfVar14[2] + 1.0) * local_108._0_4_ + -0.5;
                    }
                    else {
                      fVar21 = (pfVar14[2] * 0.5 + 0.5) * local_68;
                    }
                    local_238 = (float *)CONCAT44(local_238._4_4_,fVar21);
                    local_168 = ZEXT416((uint)fVar22);
                    local_178 = pfVar14;
                    fVar22 = floorf(fVar22);
                    local_198 = CONCAT44(extraout_XMM0_Db_11,fVar22);
                    uVar12 = (uint)fVar22;
                    local_128 = floorf((float)local_228._0_4_);
                    iVar15 = (int)local_128;
                    fVar22 = floorf((float)local_238);
                    local_138 = (void *)CONCAT44(extraout_XMM0_Db_12,fVar22);
                    iVar16 = (int)fVar22;
                    iVar18 = uVar12 + 1;
                    local_1d8._0_4_ = iVar15 + 1;
                    local_e8 = CONCAT44(local_e8._4_4_,iVar16 + 1);
                    iVar19 = (int)(float)local_f8;
                    iVar6 = local_48._0_4_;
                    local_1f8 = (ulong)uVar12;
                    fVar22 = get_value_bounded(&local_298,uVar12,iVar15,iVar16,(int)(float)local_f8,
                                               local_48._0_4_);
                    local_148 = (void *)CONCAT44(extraout_XMM0_Db_13,fVar22);
                    local_d8 = CONCAT44(local_d8._4_4_,iVar18);
                    fVar22 = get_value_bounded(&local_298,iVar18,iVar15,iVar16,iVar19,iVar6);
                    local_158 = CONCAT44(extraout_XMM0_Db_14,fVar22);
                    uVar4 = local_1d8._0_4_;
                    local_a8 = get_value_bounded(&local_298,(int)local_1f8,local_1d8._0_4_,iVar16,
                                                 iVar19,iVar6);
                    local_b8 = get_value_bounded(&local_298,iVar18,uVar4,iVar16,iVar19,iVar6);
                    iVar17 = (int)local_1f8;
                    iVar16 = (int)(float)local_e8;
                    fVar22 = get_value_bounded(&local_298,iVar17,iVar15,(int)(float)local_e8,iVar19,
                                               iVar6);
                    local_1a8 = CONCAT44(extraout_XMM0_Db_15,fVar22);
                    iVar18 = (int)(float)local_d8;
                    local_c8 = get_value_bounded(&local_298,(int)(float)local_d8,iVar15,iVar16,
                                                 iVar19,iVar6);
                    uVar4 = local_1d8._0_4_;
                    fVar22 = get_value_bounded(&local_298,iVar17,local_1d8._0_4_,iVar16,iVar19,iVar6
                                              );
                    local_1f8 = CONCAT44(extraout_XMM0_Db_16,fVar22);
                    fVar22 = get_value_bounded(&local_298,iVar18,uVar4,iVar16,iVar19,iVar6);
                    fVar26 = (float)local_168._0_4_ - (float)(int)(float)local_198;
                    fVar25 = (float)local_228._0_4_ - (float)(int)local_128;
                    fVar21 = 1.0 - fVar26;
                    fVar23 = fVar25 * (local_b8 * fVar26 + local_a8 * fVar21) +
                             (1.0 - fVar25) *
                             ((float)local_148 * fVar21 + (float)local_158 * fVar26);
                    *pfVar9 = (((1.0 - fVar25) * ((float)local_1a8 * fVar21 + local_c8 * fVar26) -
                               fVar23) + fVar25 * (fVar22 * fVar26 + (float)local_1f8 * fVar21)) *
                              ((float)local_238 - (float)(int)(float)local_138) + fVar23;
                    pfVar9 = pfVar9 + 1;
                    pfVar14 = local_178 + 3;
                    iVar19 = (int)(float)local_188 + -1;
                  } while (iVar19 != 0);
                }
                fVar22 = (float)((int)local_204 + 1);
              } while (fVar22 != fVar24);
            }
            pvVar11 = (void *)((long)local_110 + 1);
          } while (pvVar11 != local_1e0);
        }
        piVar3 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_298.allocator == (Allocator *)0x0) {
              if (local_298.data != (void *)0x0) {
                free(local_298.data);
              }
            }
            else {
              (*(local_298.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1b0 = local_1b0 + 1;
      } while (local_1b0 != uVar7);
    }
    else {
      if (iVar19 != 2) {
        if (iVar19 != 3) goto LAB_0058e687;
        forward();
        iVar6 = -1;
        goto LAB_0058dc7f;
      }
      if ((int)uVar12 < 1) goto LAB_0058e687;
      local_1d8._0_4_ = (float)(iVar16 + -1);
      local_178 = (float *)CONCAT44(local_178._4_4_,(float)(iVar17 + -1));
      local_188 = CONCAT44(local_188._4_4_,(float)iVar16 * 0.5);
      local_168._0_4_ = (float)iVar18 * 0.5;
      local_198 = CONCAT44(local_198._4_4_,(float)iVar17 * 0.5);
      local_1a8 = 0;
      do {
        local_298.c = pMVar1->d;
        uVar5 = pMVar1->elemsize;
        local_298.data = (void *)(pMVar1->cstep * local_1a8 * uVar5 + (long)pMVar1->data);
        local_298.elempack = pMVar1->elempack;
        local_298.allocator = pMVar1->allocator;
        local_298.refcount._0_4_ = 0;
        local_298.refcount._4_4_ = 0;
        local_298.elemsize._0_4_ = (undefined4)uVar5;
        local_298.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
        local_298.d = 1;
        local_298.h = pMVar1->h;
        uVar10 = (long)pMVar1->h * (long)pMVar1->w;
        local_298.w = pMVar1->w;
        local_298.dims = pMVar1->dims + -1;
        local_298.cstep = (uVar5 * uVar10 + 0xf & 0xfffffffffffffff0) / uVar5;
        if (pMVar1->dims == 4) {
          local_298.cstep = uVar10;
        }
        if (0 < (int)local_1e0._0_4_) {
          pfVar9 = (float *)(local_218->cstep * local_1a8 * local_218->elemsize +
                            (long)local_218->data);
          local_148 = pMVar1[1].data;
          local_158 = pMVar1[1].cstep * pMVar1[1].elemsize;
          pvVar11 = (void *)0x0;
          do {
            local_138 = pvVar11;
            if (0 < (int)fVar24) {
              pfVar14 = (float *)(local_158 * (long)pvVar11 + (long)local_148);
              local_1f8 = CONCAT44(local_1f8._4_4_,local_210->padding_mode);
              iVar6 = local_210->align_corner;
              fVar22 = 0.0;
              do {
                iVar19 = local_244;
                local_128 = fVar22;
                if (0 < local_244) {
                  do {
                    if (iVar6 == 0) {
                      fVar22 = (*pfVar14 + 1.0) * (float)local_188 + -0.5;
                    }
                    else {
                      fVar22 = (*pfVar14 * 0.5 + 0.5) * (float)local_1d8._0_4_;
                    }
                    if (iVar6 == 0) {
                      fVar21 = (pfVar14[1] + 1.0) * (float)local_168._0_4_ + -0.5;
                    }
                    else {
                      fVar21 = (pfVar14[1] * 0.5 + 0.5) * (float)(iVar18 + -1);
                    }
                    local_228._0_4_ = fVar21;
                    if (iVar6 == 0) {
                      fVar21 = (pfVar14[2] + 1.0) * (float)local_198 + -0.5;
                    }
                    else {
                      fVar21 = (pfVar14[2] * 0.5 + 0.5) * (float)local_178;
                    }
                    local_238 = (float *)CONCAT44(local_238._4_4_,fVar21);
                    fVar22 = roundf(fVar22);
                    fVar21 = roundf((float)local_228._0_4_);
                    fVar23 = roundf((float)local_238);
                    fVar22 = get_value_bounded(&local_298,(int)fVar22,(int)fVar21,(int)fVar23,
                                               (int)(float)local_1f8,iVar6);
                    *pfVar9 = fVar22;
                    pfVar9 = pfVar9 + 1;
                    pfVar14 = pfVar14 + 3;
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                }
                fVar22 = (float)((int)local_128 + 1);
              } while (fVar22 != fVar24);
            }
            pvVar11 = (void *)((long)local_138 + 1);
          } while (pvVar11 != local_1e0);
        }
        uVar5 = local_1a8;
        piVar3 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_298.allocator == (Allocator *)0x0) {
              if (local_298.data != (void *)0x0) {
                free(local_298.data);
              }
            }
            else {
              (*(local_298.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1a8 = uVar5 + 1;
      } while (local_1a8 != uVar7);
    }
    iVar6 = -100;
    bVar20 = true;
  }
LAB_0058e687:
  if (bVar20) {
    return 0;
  }
  return iVar6;
}

Assistant:

int GridSample::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 3)
    {
        int outw = grid.h;
        int outh = grid.c;

        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == 1) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        // bilinear interpolate
                        float v;
                        {
                            int x0 = (int)floor(sample_x);
                            int y0 = (int)floor(sample_y);
                            int x1 = x0 + 1;
                            int y1 = y0 + 1;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);

                            float alpha = sample_x - x0;
                            float beta = sample_y - y0;

                            float v0 = v00 * (1 - alpha) + v01 * alpha;
                            float v1 = v10 * (1 - alpha) + v11 * alpha;

                            v = v0 * (1 - beta) + v1 * beta;
                        }

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
        else if (sample_type == 2) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        int x0 = static_cast<int>(round(sample_x));
                        int y0 = static_cast<int>(round(sample_y));

                        float v = get_value_bounded(image, x0, y0, padding_mode, align_corner);

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
        else if (sample_type == 3) // bicubic
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        // bicubic interpolate
                        float v;
                        {
                            int x1 = (int)floorf(sample_x);
                            int y1 = (int)floorf(sample_y);
                            int x0 = x1 - 1;
                            int y0 = y1 - 1;
                            int x2 = x1 + 1;
                            int y2 = y1 + 1;
                            int x3 = x1 + 2;
                            int y3 = y1 + 2;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v02 = get_value_bounded(image, x2, y0, padding_mode, align_corner);
                            float v03 = get_value_bounded(image, x3, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);
                            float v12 = get_value_bounded(image, x2, y1, padding_mode, align_corner);
                            float v13 = get_value_bounded(image, x3, y1, padding_mode, align_corner);
                            float v20 = get_value_bounded(image, x0, y2, padding_mode, align_corner);
                            float v21 = get_value_bounded(image, x1, y2, padding_mode, align_corner);
                            float v22 = get_value_bounded(image, x2, y2, padding_mode, align_corner);
                            float v23 = get_value_bounded(image, x3, y2, padding_mode, align_corner);
                            float v30 = get_value_bounded(image, x0, y3, padding_mode, align_corner);
                            float v31 = get_value_bounded(image, x1, y3, padding_mode, align_corner);
                            float v32 = get_value_bounded(image, x2, y3, padding_mode, align_corner);
                            float v33 = get_value_bounded(image, x3, y3, padding_mode, align_corner);

                            float x_coeffs[4];
                            float y_coeffs[4];
                            interpolate_cubic(sample_x - x1, x_coeffs);
                            interpolate_cubic(sample_y - y1, y_coeffs);

                            float v0 = v00 * x_coeffs[0] + v01 * x_coeffs[1] + v02 * x_coeffs[2] + v03 * x_coeffs[3];
                            float v1 = v10 * x_coeffs[0] + v11 * x_coeffs[1] + v12 * x_coeffs[2] + v13 * x_coeffs[3];
                            float v2 = v20 * x_coeffs[0] + v21 * x_coeffs[1] + v22 * x_coeffs[2] + v23 * x_coeffs[3];
                            float v3 = v30 * x_coeffs[0] + v31 * x_coeffs[1] + v32 * x_coeffs[2] + v33 * x_coeffs[3];

                            v = v0 * y_coeffs[0] + v1 * y_coeffs[1] + v2 * y_coeffs[2] + v3 * y_coeffs[3];
                        }

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
    }

    if (dims == 4)
    {
        int outw = grid.h;
        int outh = grid.d;
        int outd = grid.c;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == 1) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    const float* gridptr = grid.channel(z);

                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = gridptr[0];
                            float sample_y = gridptr[1];
                            float sample_z = gridptr[2];

                            sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                            sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                            sample_z = grid_sample_unormalize(d, sample_z, align_corner);

                            // bilinear interpolate
                            float v;
                            {
                                int x0 = (int)floor(sample_x);
                                int y0 = (int)floor(sample_y);
                                int z0 = (int)floor(sample_z);
                                int x1 = x0 + 1;
                                int y1 = y0 + 1;
                                int z1 = z0 + 1;

                                float v000 = get_value_bounded(image, x0, y0, z0, padding_mode, align_corner);
                                float v001 = get_value_bounded(image, x1, y0, z0, padding_mode, align_corner);
                                float v010 = get_value_bounded(image, x0, y1, z0, padding_mode, align_corner);
                                float v011 = get_value_bounded(image, x1, y1, z0, padding_mode, align_corner);
                                float v100 = get_value_bounded(image, x0, y0, z1, padding_mode, align_corner);
                                float v101 = get_value_bounded(image, x1, y0, z1, padding_mode, align_corner);
                                float v110 = get_value_bounded(image, x0, y1, z1, padding_mode, align_corner);
                                float v111 = get_value_bounded(image, x1, y1, z1, padding_mode, align_corner);

                                float alpha = sample_x - x0;
                                float beta = sample_y - y0;
                                float gamma = sample_z - z0;

                                float v00 = v000 * (1 - alpha) + v001 * alpha;
                                float v01 = v010 * (1 - alpha) + v011 * alpha;
                                float v10 = v100 * (1 - alpha) + v101 * alpha;
                                float v11 = v110 * (1 - alpha) + v111 * alpha;

                                float v0 = v00 * (1 - beta) + v01 * beta;
                                float v1 = v10 * (1 - beta) + v11 * beta;

                                v = v0 * (1 - gamma) + v1 * gamma;
                            }

                            outptr[0] = v;
                            outptr += 1;

                            gridptr += 3;
                        }
                    }
                }
            }
        }
        else if (sample_type == 2) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    const float* gridptr = grid.channel(z);

                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = gridptr[0];
                            float sample_y = gridptr[1];
                            float sample_z = gridptr[2];

                            sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                            sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                            sample_z = grid_sample_unormalize(d, sample_z, align_corner);

                            int x0 = static_cast<int>(round(sample_x));
                            int y0 = static_cast<int>(round(sample_y));
                            int z0 = static_cast<int>(round(sample_z));

                            float v = get_value_bounded(image, x0, y0, z0, padding_mode, align_corner);

                            outptr[0] = v;
                            outptr += 1;

                            gridptr += 3;
                        }
                    }
                }
            }
        }
        else if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -1;
        }
    }

    return 0;
}